

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O3

void __thiscall
duckdb::ARTKey::CreateARTKey<char_const*>
          (ARTKey *this,ArenaAllocator *allocator,ARTKey *key,char *value)

{
  uint uVar1;
  size_t sVar2;
  ARTKey AVar3;
  string_t value_00;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 local_24;
  
  sVar2 = strlen((char *)key);
  uVar1 = (uint)sVar2;
  if (uVar1 < 0xd) {
    local_24 = 0;
    uStack_2c = 0;
    uStack_28 = 0;
    if (uVar1 == 0) {
      key = (ARTKey *)0x0;
    }
    else {
      switchD_012b9b0d::default(&uStack_2c,key,(ulong)(uVar1 & 0xf));
      key = (ARTKey *)CONCAT44(local_24,uStack_28);
    }
  }
  else {
    uStack_2c = (undefined4)key->len;
  }
  value_00.value.pointer.ptr = value;
  value_00.value._0_8_ = key;
  AVar3 = CreateARTKey<duckdb::string_t>(this,(ArenaAllocator *)CONCAT44(uStack_2c,uVar1),value_00);
  allocator->allocator = (Allocator *)AVar3.len;
  allocator->initial_capacity = (idx_t)AVar3.data;
  return;
}

Assistant:

void ARTKey::CreateARTKey(ArenaAllocator &allocator, ARTKey &key, const char *value) {
	ARTKey::CreateARTKey(allocator, key, string_t(value, UnsafeNumericCast<uint32_t>(strlen(value))));
}